

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateResizeBilinearLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  bool bVar1;
  ResizeBilinearLayerParams *pRVar2;
  undefined1 local_e0 [40];
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  Result::Result(__return_storage_ptr__);
  validateInputCount((Result *)local_e0,layer,1,1);
  Result::operator=(__return_storage_ptr__,(Result *)local_e0);
  std::__cxx11::string::~string((string *)(local_e0 + 8));
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    validateOutputCount((Result *)local_e0,layer,1,1);
    Result::operator=(__return_storage_ptr__,(Result *)local_e0);
    std::__cxx11::string::~string((string *)(local_e0 + 8));
  }
  bVar1 = Result::good(__return_storage_ptr__);
  if (!bVar1) {
    return __return_storage_ptr__;
  }
  if (this->ndArrayInterpretation == true) {
    std::__cxx11::string::string((string *)&local_38,"ResizeBilinear",(allocator *)&err);
    validateInputOutputRankEquality((Result *)local_e0,layer,&local_38,&this->blobNameToRank);
    Result::operator=(__return_storage_ptr__,(Result *)local_e0);
    std::__cxx11::string::~string((string *)(local_e0 + 8));
    std::__cxx11::string::~string((string *)&local_38);
    bVar1 = Result::good(__return_storage_ptr__);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::string((string *)&err,"ResizeBilinear",(allocator *)&local_98);
    validateRankCount((Result *)local_e0,layer,&err,3,-1,&this->blobNameToRank);
    Result::operator=(__return_storage_ptr__,(Result *)local_e0);
    std::__cxx11::string::~string((string *)(local_e0 + 8));
    std::__cxx11::string::~string((string *)&err);
    bVar1 = Result::good(__return_storage_ptr__);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
  }
  pRVar2 = Specification::NeuralNetworkLayer::resizebilinear(layer);
  if (((pRVar2->targetsize_).current_size_ & 0xfffffffdU) != 0) {
    std::operator+(&local_58,"Target Size in the resize bilinear layer \'",(layer->name_).ptr_);
    std::operator+(&local_98,&local_58,
                   "\' must be a vector of size 2 (i.e height, width) but is a vector of size ");
    std::__cxx11::to_string(&local_78,(pRVar2->targetsize_).current_size_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                   &local_98,&local_78);
    std::operator+(&err,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_e0,".");
    std::__cxx11::string::~string((string *)local_e0);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_58);
    Result::Result((Result *)local_e0,INVALID_MODEL_PARAMETERS,&err);
    Result::operator=(__return_storage_ptr__,(Result *)local_e0);
    std::__cxx11::string::~string((string *)(local_e0 + 8));
    std::__cxx11::string::~string((string *)&err);
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateResizeBilinearLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (r.good()) {
        r = validateOutputCount(layer, 1, 1);
    }

    if (!r.good()){ return r;}
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "ResizeBilinear", blobNameToRank);
        if (!r.good()) {return r;}
        r = validateRankCount(layer, "ResizeBilinear", 3, -1, blobNameToRank);
        if (!r.good()) {return r;}
    }

    const auto& params = layer.resizebilinear();
    // target Size must be 2D if provided
    if (!(params.targetsize_size() == 0 || params.targetsize_size() == 2)) {
        std::string err = "Target Size in the resize bilinear layer '" + layer.name() + "' must be a vector of size 2 (i.e height, width) but is a vector of size " + std::to_string(params.targetsize_size()) + ".";
        r = Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        return r;
    }

    return r;
}